

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O0

void __thiscall
lsim::SimCircuit::write_output_pins(SimCircuit *this,uint32_t comp_id,value_container_t *values)

{
  uint32_t index;
  SimComponent *this_00;
  size_type sVar1;
  size_t sVar2;
  reference pvVar3;
  uint local_2c;
  uint idx;
  SimComponent *comp;
  value_container_t *values_local;
  uint32_t comp_id_local;
  SimCircuit *this_local;
  
  this_00 = component_by_id(this,comp_id);
  if (this_00 == (SimComponent *)0x0) {
    __assert_fail("comp",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                  ,0x95,"void lsim::SimCircuit::write_output_pins(uint32_t, value_container_t)");
  }
  sVar1 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::size(values);
  sVar2 = SimComponent::num_outputs(this_00);
  if (sVar1 == sVar2) {
    local_2c = 0;
    while( true ) {
      sVar1 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::size(values);
      if (sVar1 <= local_2c) break;
      index = SimComponent::output_pin_index(this_00,local_2c);
      pvVar3 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::operator[]
                         (values,(ulong)local_2c);
      SimComponent::set_user_value(this_00,index,*pvVar3);
      local_2c = local_2c + 1;
    }
    return;
  }
  __assert_fail("values.size() == comp->num_outputs()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                ,0x97,"void lsim::SimCircuit::write_output_pins(uint32_t, value_container_t)");
}

Assistant:

void SimCircuit::write_output_pins(uint32_t comp_id, value_container_t values) {
    auto comp = component_by_id(comp_id);
    assert(comp);

    assert(values.size() == comp->num_outputs());

    for (auto idx = 0u; idx < values.size(); ++idx) {
        comp->set_user_value(comp->output_pin_index(idx), values[idx]);
    }
}